

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

void cmSystemTools::FindCMakeResources(char *argv0)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_07;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_08;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_09;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_10;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_11;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_12;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string exe_dir;
  string dir;
  string src_dir;
  string exe;
  string src_dir_txt;
  string errorMsg;
  string prefix;
  ifstream fin;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  char *local_420;
  undefined8 local_418;
  string local_238;
  char *local_218;
  undefined8 local_210;
  size_t local_208;
  char *local_200;
  undefined8 local_1f8;
  
  local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
  local_560._M_string_length = 0;
  local_560.field_2._M_local_buf[0] = '\0';
  local_480._M_string_length = 0;
  local_480.field_2._M_local_buf[0] = '\0';
  local_4c0._M_string_length = 0;
  local_4c0.field_2._M_local_buf[0] = '\0';
  local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  bVar3 = cmsys::SystemTools::FindProgramPath(argv0,&local_4c0,&local_480);
  if (bVar3) {
    cmsys::SystemTools::GetRealPath(&local_238,&local_4c0,(string *)0x0);
    std::__cxx11::string::operator=((string *)&local_4c0,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::GetFilenamePath(&local_238,&local_4c0);
    std::__cxx11::string::operator=((string *)&local_560,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
  }
  cmsys::SystemTools::GetActualCaseForPath(&local_238,&local_560);
  std::__cxx11::string::operator=((string *)&local_560,(string *)&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = cmsys::SystemTools::GetExecutableExtension();
  local_238._M_dataplus._M_p = (pointer)local_560._M_string_length;
  local_238._M_string_length = (size_type)local_560._M_dataplus._M_p;
  local_238.field_2._M_allocated_capacity = 0;
  local_238.field_2._8_8_ = 6;
  local_218 = "/cmake";
  local_210 = 0;
  local_208 = strlen(pcVar5);
  local_1f8 = 0;
  views._M_len = 3;
  views._M_array = (iterator)&local_238;
  local_200 = pcVar5;
  cmCatViews(&local_440,views);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCMakeCommand_abi_cxx11_,(string *)&local_440);
  paVar2 = &local_440.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != paVar2) {
    operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = cmsys::SystemTools::GetExecutableExtension();
  local_238._M_dataplus._M_p = (pointer)local_560._M_string_length;
  local_238._M_string_length = (size_type)local_560._M_dataplus._M_p;
  local_238.field_2._M_allocated_capacity = 0;
  local_238.field_2._8_8_ = 6;
  local_218 = "/ctest";
  local_210 = 0;
  local_208 = strlen(pcVar5);
  local_1f8 = 0;
  views_00._M_len = 3;
  views_00._M_array = (iterator)&local_238;
  local_200 = pcVar5;
  cmCatViews(&local_440,views_00);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCTestCommand_abi_cxx11_,(string *)&local_440);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != paVar2) {
    operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = cmsys::SystemTools::GetExecutableExtension();
  local_238._M_dataplus._M_p = (pointer)local_560._M_string_length;
  local_238._M_string_length = (size_type)local_560._M_dataplus._M_p;
  local_238.field_2._M_allocated_capacity = 0;
  local_238.field_2._8_8_ = 6;
  local_218 = "/cpack";
  local_210 = 0;
  local_208 = strlen(pcVar5);
  local_1f8 = 0;
  views_01._M_len = 3;
  views_01._M_array = (iterator)&local_238;
  local_200 = pcVar5;
  cmCatViews(&local_440,views_01);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCPackCommand_abi_cxx11_,(string *)&local_440);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != paVar2) {
    operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = cmsys::SystemTools::GetExecutableExtension();
  local_238._M_dataplus._M_p = (pointer)local_560._M_string_length;
  local_238._M_string_length = (size_type)local_560._M_dataplus._M_p;
  local_238.field_2._M_allocated_capacity = 0;
  local_238.field_2._8_8_ = 10;
  local_218 = "/cmake-gui";
  local_210 = 0;
  local_208 = strlen(pcVar5);
  local_1f8 = 0;
  views_02._M_len = 3;
  views_02._M_array = (iterator)&local_238;
  local_200 = pcVar5;
  cmCatViews(&local_440,views_02);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCMakeGUICommand_abi_cxx11_,(string *)&local_440);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != paVar2) {
    operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
  }
  bVar3 = cmsys::SystemTools::FileExists(&cmSystemToolsCMakeGUICommand_abi_cxx11_);
  if (!bVar3) {
    cmSystemToolsCMakeGUICommand_abi_cxx11_._M_string_length = 0;
    *cmSystemToolsCMakeGUICommand_abi_cxx11_._M_dataplus._M_p = '\0';
  }
  pcVar5 = cmsys::SystemTools::GetExecutableExtension();
  local_238._M_dataplus._M_p = (pointer)local_560._M_string_length;
  local_238._M_string_length = (size_type)local_560._M_dataplus._M_p;
  local_238.field_2._M_allocated_capacity = 0;
  local_238.field_2._8_8_ = 7;
  local_218 = "/ccmake";
  local_210 = 0;
  local_208 = strlen(pcVar5);
  local_1f8 = 0;
  views_03._M_len = 3;
  views_03._M_array = (iterator)&local_238;
  local_200 = pcVar5;
  cmCatViews(&local_440,views_03);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCMakeCursesCommand_abi_cxx11_,(string *)&local_440);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != paVar2) {
    operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
  }
  bVar3 = cmsys::SystemTools::FileExists(&cmSystemToolsCMakeCursesCommand_abi_cxx11_);
  if (!bVar3) {
    cmSystemToolsCMakeCursesCommand_abi_cxx11_._M_string_length = 0;
    *cmSystemToolsCMakeCursesCommand_abi_cxx11_._M_dataplus._M_p = '\0';
  }
  pcVar5 = cmsys::SystemTools::GetExecutableExtension();
  local_238._M_dataplus._M_p = (pointer)local_560._M_string_length;
  local_238._M_string_length = (size_type)local_560._M_dataplus._M_p;
  local_238.field_2._M_allocated_capacity = 0;
  local_238.field_2._8_8_ = 9;
  local_218 = "/cmcldeps";
  local_210 = 0;
  local_208 = strlen(pcVar5);
  local_1f8 = 0;
  views_04._M_len = 3;
  views_04._M_array = (iterator)&local_238;
  local_200 = pcVar5;
  cmCatViews(&local_440,views_04);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCMClDepsCommand_abi_cxx11_,(string *)&local_440);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != paVar2) {
    operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
  }
  bVar3 = cmsys::SystemTools::FileExists(&cmSystemToolsCMClDepsCommand_abi_cxx11_);
  if (!bVar3) {
    cmSystemToolsCMClDepsCommand_abi_cxx11_._M_string_length = 0;
    *cmSystemToolsCMClDepsCommand_abi_cxx11_._M_dataplus._M_p = '\0';
  }
  local_238._M_dataplus._M_p = (pointer)local_560._M_string_length;
  local_238._M_string_length = (size_type)local_560._M_dataplus._M_p;
  if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x3 < local_560._M_string_length) &&
     (__str._M_str = "/bin", __str._M_len = 4,
     iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                       ((basic_string_view<char,_std::char_traits<char>_> *)&local_238,
                        (size_type)(local_560._M_string_length + -4),4,__str), iVar4 == 0)) {
    std::__cxx11::string::substr((ulong)&local_440,(ulong)&local_560);
    local_238._M_dataplus._M_p = (pointer)local_440._M_string_length;
    local_238._M_string_length = (size_type)local_440._M_dataplus._M_p;
    local_238.field_2._M_allocated_capacity = 0;
    local_238.field_2._8_8_ = 0x11;
    local_218 = "/share/cmake-3.29";
    local_210 = 0;
    views_05._M_len = 2;
    views_05._M_array = (iterator)&local_238;
    cmCatViews(&local_540,views_05);
    std::__cxx11::string::operator=
              ((string *)&cmSystemToolsCMakeRoot_abi_cxx11_,(string *)&local_540);
    paVar1 = &local_540.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540._M_dataplus._M_p != paVar1) {
      operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
    }
    local_238._M_dataplus._M_p = (pointer)local_440._M_string_length;
    local_238._M_string_length = (size_type)local_440._M_dataplus._M_p;
    local_238.field_2._M_allocated_capacity = 0;
    local_238.field_2._8_8_ = 0x1f;
    local_218 = "/doc/cmake-3.29/html/index.html";
    local_210 = 0;
    views_06._M_len = 2;
    views_06._M_array = (iterator)&local_238;
    cmCatViews(&local_540,views_06);
    bVar3 = cmsys::SystemTools::FileExists(&local_540);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540._M_dataplus._M_p != paVar1) {
      operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      local_238._M_dataplus._M_p = (pointer)local_440._M_string_length;
      local_238._M_string_length = (size_type)local_440._M_dataplus._M_p;
      local_238.field_2._M_allocated_capacity = 0;
      local_238.field_2._8_8_ = 0x14;
      local_218 = "/doc/cmake-3.29/html";
      local_210 = 0;
      views_07._M_len = 2;
      views_07._M_array = (iterator)&local_238;
      cmCatViews(&local_540,views_07);
      std::__cxx11::string::operator=
                ((string *)&cmSystemToolsHTMLDoc_abi_cxx11_,(string *)&local_540);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_540._M_dataplus._M_p != paVar1) {
        operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != paVar2) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
  }
  if (cmSystemToolsCMakeRoot_abi_cxx11_._M_string_length == 0) {
    bVar3 = true;
  }
  else {
    local_238._M_dataplus._M_p = (pointer)cmSystemToolsCMakeRoot_abi_cxx11_._M_string_length;
    local_238._M_string_length = (size_type)cmSystemToolsCMakeRoot_abi_cxx11_._M_dataplus._M_p;
    local_238.field_2._M_allocated_capacity = 0;
    local_238.field_2._8_8_ = 0x14;
    local_218 = "/Modules/CMake.cmake";
    local_210 = 0;
    views_08._M_len = 2;
    views_08._M_array = (iterator)&local_238;
    cmCatViews(&local_540,views_08);
    bVar3 = cmsys::SystemTools::FileExists(&local_540);
    bVar3 = !bVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540._M_dataplus._M_p != &local_540.field_2) {
      operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar3) {
    cmsys::SystemTools::GetFilenamePath(&local_520,&local_560);
    local_238._M_dataplus._M_p = (pointer)local_520._M_string_length;
    local_238._M_string_length = (size_type)local_520._M_dataplus._M_p;
    local_238.field_2._M_allocated_capacity = 0;
    local_238.field_2._8_8_ = 0x1e;
    local_218 = "/CMakeFiles/CMakeSourceDir.txt";
    local_210 = 0;
    views_09._M_len = 2;
    views_09._M_array = (iterator)&local_238;
    cmCatViews(&local_4a0,views_09);
    std::ifstream::ifstream(&local_238,local_4a0._M_dataplus._M_p,_S_in);
    paVar1 = &local_500.field_2;
    local_500._M_string_length = 0;
    local_500.field_2._M_local_buf[0] = '\0';
    local_500._M_dataplus._M_p = (pointer)paVar1;
    if ((((*(byte *)((long)&local_218 + *(long *)(local_238._M_dataplus._M_p + -0x18)) & 5) == 0) &&
        (bVar3 = cmsys::SystemTools::GetLineFromStream
                           ((istream *)&local_238,&local_500,(bool *)0x0,0xffffffffffffffff), bVar3)
        ) && (bVar3 = cmsys::SystemTools::FileIsDirectory(&local_500), bVar3)) {
      std::__cxx11::string::_M_assign((string *)&cmSystemToolsCMakeRoot_abi_cxx11_);
    }
    else {
      cmsys::SystemTools::GetFilenamePath(&local_440,&local_520);
      std::__cxx11::string::operator=((string *)&local_520,(string *)&local_440);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._M_dataplus._M_p != paVar2) {
        operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
      }
      local_440._M_dataplus._M_p = (pointer)local_520._M_string_length;
      local_440._M_string_length = (size_type)local_520._M_dataplus._M_p;
      local_440.field_2._M_allocated_capacity = 0;
      local_440.field_2._8_8_ = 0x1e;
      local_420 = "/CMakeFiles/CMakeSourceDir.txt";
      local_418 = 0;
      views_10._M_len = 2;
      views_10._M_array = (iterator)&local_440;
      cmCatViews(&local_4e0,views_10);
      std::__cxx11::string::operator=((string *)&local_4a0,(string *)&local_4e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
        operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
      }
      std::ifstream::ifstream(&local_440,local_4a0._M_dataplus._M_p,_S_in);
      if ((((*(byte *)((long)&local_420 + *(long *)(local_440._M_dataplus._M_p + -0x18)) & 5) == 0)
          && (bVar3 = cmsys::SystemTools::GetLineFromStream
                                ((istream *)&local_440,&local_500,(bool *)0x0,0xffffffffffffffff),
             bVar3)) && (bVar3 = cmsys::SystemTools::FileIsDirectory(&local_500), bVar3)) {
        std::__cxx11::string::_M_assign((string *)&cmSystemToolsCMakeRoot_abi_cxx11_);
      }
      std::ifstream::~ifstream(&local_440);
    }
    if (cmSystemToolsHTMLDoc_abi_cxx11_._M_string_length == 0 &&
        cmSystemToolsCMakeRoot_abi_cxx11_._M_string_length != 0) {
      local_440._M_dataplus._M_p = (pointer)local_520._M_string_length;
      local_440._M_string_length = (size_type)local_520._M_dataplus._M_p;
      local_440.field_2._M_allocated_capacity = 0;
      local_440.field_2._8_8_ = 0x21;
      local_420 = "/Utilities/Sphinx/html/index.html";
      local_418 = 0;
      views_11._M_len = 2;
      views_11._M_array = (iterator)&local_440;
      cmCatViews(&local_4e0,views_11);
      bVar3 = cmsys::SystemTools::FileExists(&local_4e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
        operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar3 = false;
    }
    if (bVar3 != false) {
      local_440._M_dataplus._M_p = (pointer)local_520._M_string_length;
      local_440._M_string_length = (size_type)local_520._M_dataplus._M_p;
      local_440.field_2._M_allocated_capacity = 0;
      local_440.field_2._8_8_ = 0x16;
      local_420 = "/Utilities/Sphinx/html";
      local_418 = 0;
      views_12._M_len = 2;
      views_12._M_array = (iterator)&local_440;
      cmCatViews(&local_460,views_12);
      std::__cxx11::string::operator=
                ((string *)&cmSystemToolsHTMLDoc_abi_cxx11_,(string *)&local_460);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_dataplus._M_p != &local_460.field_2) {
        operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_dataplus._M_p != paVar1) {
      operator_delete(local_500._M_dataplus._M_p,
                      CONCAT71(local_500.field_2._M_allocated_capacity._1_7_,
                               local_500.field_2._M_local_buf[0]) + 1);
    }
    std::ifstream::~ifstream(&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != &local_520.field_2) {
      operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
    operator_delete(local_4c0._M_dataplus._M_p,
                    CONCAT71(local_4c0.field_2._M_allocated_capacity._1_7_,
                             local_4c0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,
                    CONCAT71(local_480.field_2._M_allocated_capacity._1_7_,
                             local_480.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p != &local_560.field_2) {
    operator_delete(local_560._M_dataplus._M_p,
                    CONCAT71(local_560.field_2._M_allocated_capacity._1_7_,
                             local_560.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmSystemTools::ExpandRegistryValues(std::string& source,
                                         KeyWOW64 /*unused*/)
{
  cmsys::RegularExpression regEntry("\\[(HKEY[^]]*)\\]");
  while (regEntry.find(source)) {
    // the arguments are the second match
    std::string key = regEntry.match(1);
    std::string reg = cmStrCat('[', key, ']');
    cmSystemTools::ReplaceString(source, reg.c_str(), "/registry");
  }
}